

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.cpp
# Opt level: O3

void __thiscall
LocalGraphTest_ObstacleMultiSetIf_Test::TestBody(LocalGraphTest_ObstacleMultiSetIf_Test *this)

{
  Export *pEVar1;
  ulong uVar2;
  undefined8 *puVar3;
  LocalSet *set;
  LocalSet *set_00;
  SetInfluences *pSVar4;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  undefined1 local_608 [8];
  Module wasm;
  LazyLocalGraph graph;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  char local_1f8;
  long *local_a8 [2];
  long local_98 [2];
  char local_88;
  undefined1 local_80 [8];
  Type local_78;
  AssertHelperData *local_68;
  uint local_44;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  AssertHelper local_30;
  
  ::wasm::Module::Module((Module *)local_608);
  local_88 = '\0';
  ::wasm::WATParser::parseModule
            (&wasm.tagsMap._M_h._M_single_bucket,(Module *)local_608,0x1a1,
             "\n    (module\n      (func $foo\n        ;; Two sets in an if.\n        (local $x i32)\n        (if\n          (i32.const 42)\n          (then\n            (local.set $x\n              (i32.const 10)\n            )\n          )\n          (else\n            (local.set $x\n              (i32.const 20)\n            )\n          )\n        )\n        (nop)\n        (drop\n          (local.get $x)\n        )\n        (nop)\n      )\n    )\n  "
             ,local_a8);
  local_80[0] = (internal)(local_1f8 != '\x01');
  local_78.id = 0;
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&wasm.tagsMap._M_h._M_single_bucket);
  if (local_88 == '\x01') {
    local_88 = '\0';
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0],local_98[0] + 1);
    }
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&wasm.tagsMap._M_h._M_single_bucket,(internal *)local_80,
               (AssertionResult *)"WATParser::parseModule(wasm, moduleText).getErr()","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
               ,0x117,(char *)wasm.tagsMap._M_h._M_single_bucket);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wasm.tagsMap._M_h._M_single_bucket != &local_208) {
      operator_delete(wasm.tagsMap._M_h._M_single_bucket,local_208._M_allocated_capacity + 1);
    }
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id)
      ;
    }
LAB_001a9bce:
    ::wasm::Module::~Module((Module *)local_608);
    return;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id);
  }
  pEVar1 = ((wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
  pcVar5 = *(char **)(pEVar1 + 0x60);
  if (*pcVar5 == '\x01') {
    uVar2 = *(ulong *)(pcVar5 + 0x28);
    if (uVar2 == 0) goto LAB_001a9bea;
    puVar3 = *(undefined8 **)(pcVar5 + 0x20);
    pcVar5 = (char *)*puVar3;
    if (*pcVar5 == '\x02') {
      set = *(LocalSet **)(pcVar5 + 0x18);
      if (((set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id ==
           LocalSetId) &&
         (set_00 = *(LocalSet **)(pcVar5 + 0x20),
         (set_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id ==
         LocalSetId)) {
        if (uVar2 == 1) {
LAB_001a9bea:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        if (*(char *)puVar3[1] == '\x16') {
          if (uVar2 < 4) goto LAB_001a9bea;
          if (*(char *)puVar3[3] == '\x16') {
            ::wasm::LazyLocalGraph::LazyLocalGraph
                      ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket,pEVar1,local_608,0x116)
            ;
            pSVar4 = ::wasm::LazyLocalGraph::getSetInfluences
                               ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket,set);
            local_40._M_head_impl =
                 *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (pSVar4 + 0x18);
            local_30.data_._0_4_ = 1;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)local_80,"graph.getSetInfluences(setA).size()","1U",
                       (unsigned_long *)&local_40,(uint *)&local_30);
            if (local_80[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_40);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id
                  == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = *(char **)local_78.id;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0x122,pcVar5);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if (local_40._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_40._M_head_impl + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78.id);
            }
            pSVar4 = ::wasm::LazyLocalGraph::getSetInfluences
                               ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket,set_00);
            local_40._M_head_impl =
                 *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (pSVar4 + 0x18);
            local_30.data_._0_4_ = 1;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)local_80,"graph.getSetInfluences(setB).size()","1U",
                       (unsigned_long *)&local_40,(uint *)&local_30);
            if (local_80[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_40);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id
                  == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = *(char **)local_78.id;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0x123,pcVar5);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if (local_40._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_40._M_head_impl + 8))();
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.id !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78.id);
            }
            ::wasm::LazyLocalGraph::canMoveSet
                      ((LocalSet *)local_80,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
            local_30.data_ = local_68;
            local_44 = 0;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&local_40,"graph.canMoveSet(setA, nopA).size()","0U",
                       (unsigned_long *)&local_30,&local_44);
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_80);
            if (local_40._M_head_impl._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)local_80);
              if (local_38 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = (local_38->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0x125,pcVar5);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_80._1_7_,local_80[0]) + 8))();
              }
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
            ::wasm::LazyLocalGraph::canMoveSet
                      ((LocalSet *)local_80,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
            local_30.data_ = local_68;
            local_44 = 0;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&local_40,"graph.canMoveSet(setB, nopA).size()","0U",
                       (unsigned_long *)&local_30,&local_44);
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_80);
            if (local_40._M_head_impl._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)local_80);
              if (local_38 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = (local_38->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0x126,pcVar5);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_80._1_7_,local_80[0]) + 8))();
              }
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
            ::wasm::LazyLocalGraph::canMoveSet
                      ((LocalSet *)local_80,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
            local_30.data_ = local_68;
            local_44 = 1;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&local_40,"graph.canMoveSet(setA, nopB).size()","1U",
                       (unsigned_long *)&local_30,&local_44);
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_80);
            if (local_40._M_head_impl._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)local_80);
              if (local_38 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = (local_38->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0x128,pcVar5);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_80._1_7_,local_80[0]) + 8))();
              }
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
            ::wasm::LazyLocalGraph::canMoveSet
                      ((LocalSet *)local_80,(Expression *)&wasm.tagsMap._M_h._M_single_bucket);
            local_30.data_ = local_68;
            local_44 = 1;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)&local_40,"graph.canMoveSet(setB, nopB).size()","1U",
                       (unsigned_long *)&local_30,&local_44);
            std::
            _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_80);
            if (local_40._M_head_impl._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)local_80);
              if (local_38 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = (local_38->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/local-graph.cpp"
                         ,0x129,pcVar5);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)local_80);
              testing::internal::AssertHelper::~AssertHelper(&local_30);
              if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT71(local_80._1_7_,local_80[0]) + 8))();
              }
            }
            if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_38,local_38);
            }
            ::wasm::LazyLocalGraph::~LazyLocalGraph
                      ((LazyLocalGraph *)&wasm.tagsMap._M_h._M_single_bucket);
            goto LAB_001a9bce;
          }
        }
        pcVar5 = "T *wasm::Expression::cast() [T = wasm::Nop]";
      }
      else {
        pcVar5 = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      }
    }
    else {
      pcVar5 = "T *wasm::Expression::cast() [T = wasm::If]";
    }
  }
  else {
    pcVar5 = "T *wasm::Expression::cast() [T = wasm::Block]";
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,pcVar5);
}

Assistant:

TEST_F(LocalGraphTest, ObstacleMultiSetIf) {
  auto moduleText = R"wasm(
    (module
      (func $foo
        ;; Two sets in an if.
        (local $x i32)
        (if
          (i32.const 42)
          (then
            (local.set $x
              (i32.const 10)
            )
          )
          (else
            (local.set $x
              (i32.const 20)
            )
          )
        )
        (nop)
        (drop
          (local.get $x)
        )
        (nop)
      )
    )
  )wasm";
  Module wasm;
  ASSERT_FALSE(WATParser::parseModule(wasm, moduleText).getErr());
  auto* func = wasm.functions[0].get();
  auto* block = func->body->cast<Block>();
  auto* iff = block->list[0]->cast<If>();
  auto* setA = iff->ifTrue->cast<LocalSet>();
  auto* setB = iff->ifFalse->cast<LocalSet>();
  auto* nopA = block->list[1]->cast<Nop>();
  auto* nopB = block->list[3]->cast<Nop>();

  LazyLocalGraph graph(func, &wasm, Nop::SpecificId);
  // Both sets have a get.
  EXPECT_EQ(graph.getSetInfluences(setA).size(), 1U);
  EXPECT_EQ(graph.getSetInfluences(setB).size(), 1U);
  // The first nop blocks both.
  EXPECT_EQ(graph.canMoveSet(setA, nopA).size(), 0U);
  EXPECT_EQ(graph.canMoveSet(setB, nopA).size(), 0U);
  // The first nop blocks neither.
  EXPECT_EQ(graph.canMoveSet(setA, nopB).size(), 1U);
  EXPECT_EQ(graph.canMoveSet(setB, nopB).size(), 1U);
}